

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_container_unit.c
# Opt level: O0

void printf_test(void)

{
  bitset_container_t *bitset;
  bitset_container_t *B;
  char *in_stack_00000008;
  unsigned_long in_stack_00000010;
  bitset_container_t *in_stack_00000020;
  
  bitset = bitset_container_create();
  _assert_true(in_stack_00000010,in_stack_00000008,(char *)B,(int)((ulong)bitset >> 0x20));
  bitset_container_set(bitset,1);
  bitset_container_set(bitset,2);
  bitset_container_set(bitset,3);
  bitset_container_set(bitset,10);
  bitset_container_set(bitset,10000);
  bitset_container_printf(in_stack_00000020);
  printf("\n");
  bitset_container_free((bitset_container_t *)0x10280c);
  return;
}

Assistant:

DEFINE_TEST(printf_test) {
    bitset_container_t* B = bitset_container_create();
    assert_non_null(B);

    bitset_container_set(B, 1U);
    bitset_container_set(B, 2U);
    bitset_container_set(B, 3U);
    bitset_container_set(B, 10U);
    bitset_container_set(B, 10000U);

    bitset_container_printf(B);  // does it crash?
    printf("\n");

    bitset_container_free(B);
}